

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

int proxy_h2_on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  int iVar4;
  Curl_easy *data;
  char buffer [256];
  char acStack_138 [264];
  
  lVar2 = *(long *)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)(lVar2 + 8);
  }
  uVar1 = (frame->hd).stream_id;
  if ((((data != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < *(int *)(*userp + 0xc))) {
    iVar4 = proxy_h2_fr_print(frame,acStack_138,(size_t)userp);
    acStack_138[iVar4] = '\0';
    if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] <- %s",(ulong)(uint)(frame->hd).stream_id,
                        acStack_138);
    }
  }
  if (uVar1 == 0) {
    if ((frame->hd).type == '\a') {
      *(byte *)(lVar2 + 0x140) = *(byte *)(lVar2 + 0x140) | 2;
      return 0;
    }
    if ((frame->hd).type != '\x04') {
      return 0;
    }
    uVar1 = (data->req).keepon;
  }
  else {
    if (uVar1 != *(uint *)(lVar2 + 0x120)) {
      if (data == (Curl_easy *)0x0) {
        return -0x386;
      }
      if (userp == (void *)0x0) {
        return -0x386;
      }
      if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
        return -0x386;
      }
      if (*(int *)(*userp + 0xc) < 1) {
        return -0x386;
      }
      Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] rcvd FRAME not for tunnel",(ulong)uVar1);
      return -0x386;
    }
    if ((frame->hd).type != '\b') {
      if ((frame->hd).type != '\x01') {
        return 0;
      }
      puVar3 = *(uint **)(lVar2 + 0x90);
      if (puVar3 != (uint *)0x0) {
        if (((data != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < *(int *)(*userp + 0xc)))
           )) {
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] got http status: %d",(ulong)uVar1,
                            (ulong)*puVar3);
        }
        if ((*(byte *)(lVar2 + 0x134) & 1) != 0) {
          return 0;
        }
        if (**(int **)(lVar2 + 0x90) - 100U < 100) {
          return 0;
        }
        *(byte *)(lVar2 + 0x134) = *(byte *)(lVar2 + 0x134) | 1;
        return 0;
      }
      return -0x386;
    }
    uVar1 = (data->req).keepon;
  }
  if ((uVar1 & 0x2a) == 2) {
    drain_tunnel((Curl_cfilter *)userp,data,(tunnel_stream *)(lVar2 + 0x90));
  }
  return 0;
}

Assistant:

static int proxy_h2_on_frame_recv(nghttp2_session *session,
                                  const nghttp2_frame *frame,
                                  void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  int32_t stream_id = frame->hd.stream_id;

  (void)session;
  DEBUGASSERT(data);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  if(Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = proxy_h2_fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] <- %s",frame->hd.stream_id, buffer);
  }
#endif /* !CURL_DISABLE_VERBOSE_STRINGS */

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    DEBUGASSERT(data);
    switch(frame->hd.type) {
    case NGHTTP2_SETTINGS:
      /* Since the initial stream window is 64K, a request might be on HOLD,
       * due to exhaustion. The (initial) SETTINGS may announce a much larger
       * window and *assume* that we treat this like a WINDOW_UPDATE. Some
       * servers send an explicit WINDOW_UPDATE, but not all seem to do that.
       * To be safe, we UNHOLD a stream in order not to stall. */
      if(CURL_WANT_SEND(data)) {
        drain_tunnel(cf, data, &ctx->tunnel);
      }
      break;
    case NGHTTP2_GOAWAY:
      ctx->goaway = TRUE;
      break;
    default:
      break;
    }
    return 0;
  }

  if(stream_id != ctx->tunnel.stream_id) {
    CURL_TRC_CF(data, cf, "[%d] rcvd FRAME not for tunnel", stream_id);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  switch(frame->hd.type) {
  case NGHTTP2_HEADERS:
    /* nghttp2 guarantees that :status is received, and we store it to
       stream->status_code. Fuzzing has proven this can still be reached
       without status code having been set. */
    if(!ctx->tunnel.resp)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* Only final status code signals the end of header */
    CURL_TRC_CF(data, cf, "[%d] got http status: %d",
                stream_id, ctx->tunnel.resp->status);
    if(!ctx->tunnel.has_final_response) {
      if(ctx->tunnel.resp->status / 100 != 1) {
        ctx->tunnel.has_final_response = TRUE;
      }
    }
    break;
  case NGHTTP2_WINDOW_UPDATE:
    if(CURL_WANT_SEND(data)) {
      drain_tunnel(cf, data, &ctx->tunnel);
    }
    break;
  default:
    break;
  }
  return 0;
}